

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O0

void __thiscall
BayesianGameCollaborativeGraphical::RecurseOverAgents
          (BayesianGameCollaborativeGraphical *this,Index currentAgent,
          vector<bool,_std::allocator<bool>_> *agentVisited)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  undefined8 in_RDX;
  value_type in_ESI;
  long *in_RDI;
  reference rVar6;
  reference rVar7;
  Index i_1;
  Index ag;
  Index i;
  Scope lrfScope;
  Index e;
  Scope neighbors;
  reference in_stack_ffffffffffffff08;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff28;
  Scope *in_stack_ffffffffffffff30;
  reference local_90;
  uint local_7c;
  value_type local_78;
  uint local_74;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  uint local_44;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  undefined4 in_stack_fffffffffffffff0;
  
  rVar6 = std::vector<bool,_std::allocator<bool>_>::at
                    (in_stack_ffffffffffffff10,(size_type)in_stack_ffffffffffffff08);
  std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffffd8,true);
  Scope::Scope((Scope *)in_stack_ffffffffffffff10);
  local_44 = 0;
  while( true ) {
    uVar2 = (ulong)local_44;
    uVar3 = (**(code **)(*in_RDI + 0xa8))();
    if (uVar2 == uVar3) break;
    (**(code **)(*in_RDI + 0xb0))(&local_70,in_RDI,local_44);
    bVar1 = Scope::Contains(in_stack_ffffffffffffff30,
                            (Index)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    if (bVar1) {
      for (local_74 = 0; uVar2 = (ulong)local_74,
          sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_70),
          uVar2 != sVar4; local_74 = local_74 + 1) {
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            in_stack_ffffffffffffff10,(size_type)in_stack_ffffffffffffff08);
        local_78 = *pvVar5;
        if ((local_78 != in_ESI) &&
           (bVar1 = Scope::Contains(in_stack_ffffffffffffff30,
                                    (Index)((ulong)in_stack_ffffffffffffff28 >> 0x20)), !bVar1)) {
          Scope::Insert((Scope *)in_stack_ffffffffffffff10,
                        (Index)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        }
      }
    }
    Scope::~Scope((Scope *)0x8b1b6d);
    local_44 = local_44 + 1;
  }
  local_7c = 0;
  while( true ) {
    uVar2 = (ulong)local_7c;
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_40);
    if (uVar2 == sVar4) break;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff10,
               (size_type)in_stack_ffffffffffffff08);
    rVar7 = std::vector<bool,_std::allocator<bool>_>::at
                      (in_stack_ffffffffffffff10,(size_type)in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff10 = (vector<bool,_std::allocator<bool>_> *)rVar7._M_mask;
    local_90 = rVar7;
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_90);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      in_stack_ffffffffffffff08 =
           std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      in_stack_ffffffffffffff10,(size_type)in_stack_ffffffffffffff08);
      RecurseOverAgents((BayesianGameCollaborativeGraphical *)
                        CONCAT44(in_ESI,in_stack_fffffffffffffff0),(Index)((ulong)in_RDX >> 0x20),
                        (vector<bool,_std::allocator<bool>_> *)rVar6._M_mask);
    }
    local_7c = local_7c + 1;
  }
  Scope::~Scope((Scope *)0x8b1c72);
  return;
}

Assistant:

void BayesianGameCollaborativeGraphical::RecurseOverAgents(Index currentAgent,
                                                 vector<bool> &agentVisited) const
{
    agentVisited.at(currentAgent)=true;
    Scope neighbors;
    for(Index e=0;e!=GetNrLRFs();++e)
    {
        Scope lrfScope=GetScope(e);
        if(lrfScope.Contains(currentAgent))
        {
            for(Index i=0;i!=lrfScope.size();++i)
            {
                Index ag=lrfScope.at(i);
                if(ag!=currentAgent &&
                   !neighbors.Contains(ag))
                    neighbors.Insert(ag);
            }
        }
    }
    for(Index i=0;i!=neighbors.size();++i)
        if(!agentVisited.at(neighbors.at(i)))
            RecurseOverAgents(neighbors.at(i),agentVisited);
}